

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_CreateLevelR(Vec_Wec_t *vFanouts,Vec_Int_t *vLevelsR,Vec_Str_t *vEmpty)

{
  int iVar1;
  Vec_Int_t *vArray_00;
  int local_2c;
  int i;
  Vec_Int_t *vArray;
  Vec_Str_t *vEmpty_local;
  Vec_Int_t *vLevelsR_local;
  Vec_Wec_t *vFanouts_local;
  
  iVar1 = Vec_IntSize(vLevelsR);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(vLevelsR) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x96,"void Sfm_CreateLevelR(Vec_Wec_t *, Vec_Int_t *, Vec_Str_t *)");
  }
  iVar1 = Vec_WecSize(vFanouts);
  Vec_IntFill(vLevelsR,iVar1,0);
  local_2c = Vec_WecSize(vFanouts);
  while (local_2c = local_2c + -1, -1 < local_2c) {
    vArray_00 = Vec_WecEntry(vFanouts,local_2c);
    iVar1 = Sfm_ObjAddsLevelArray(vEmpty,local_2c);
    iVar1 = Sfm_ObjLevelNewR(vArray_00,vLevelsR,iVar1);
    Vec_IntWriteEntry(vLevelsR,local_2c,iVar1);
  }
  return;
}

Assistant:

void Sfm_CreateLevelR( Vec_Wec_t * vFanouts, Vec_Int_t * vLevelsR, Vec_Str_t * vEmpty )
{
    Vec_Int_t * vArray;
    int i;
    assert( Vec_IntSize(vLevelsR) == 0 );
    Vec_IntFill( vLevelsR, Vec_WecSize(vFanouts), 0 );
    Vec_WecForEachLevelReverse( vFanouts, vArray, i )
        Vec_IntWriteEntry( vLevelsR, i, Sfm_ObjLevelNewR(vArray, vLevelsR, Sfm_ObjAddsLevelArray(vEmpty, i)) );
}